

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

uint256 * __thiscall
node::anon_unknown_2::NodeImpl::getBestBlockHash(uint256 *__return_storage_ptr__,NodeImpl *this)

{
  pointer ppCVar1;
  uint256 *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar8;
  Chainstate *pCVar9;
  CBlockIndex *pCVar10;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock22;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_30._M_device = &cs_main.super_recursive_mutex;
  local_30._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_30);
  puVar8 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                     (&this->m_context->chainman,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                      ,0x1a6,"chainman","m_context->chainman");
  pCVar9 = ChainstateManager::ActiveChainstate
                     ((puVar8->_M_t).
                      super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                      .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl);
  ppCVar1 = (pCVar9->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar1 ==
      (pCVar9->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    pCVar10 = (CBlockIndex *)0x0;
  }
  else {
    pCVar10 = ppCVar1[-1];
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
  if (pCVar10 == (CBlockIndex *)0x0) {
    puVar8 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                       (&this->m_context->chainman,
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp"
                        ,0x1a6,"chainman","m_context->chainman");
    CBlockHeader::GetHash
              (__return_storage_ptr__,
               &(((((puVar8->_M_t).
                    super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                    .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl)->m_options).
                 chainparams)->genesis).super_CBlockHeader);
  }
  else {
    puVar2 = pCVar10->phashBlock;
    if (puVar2 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    uVar3 = *(undefined4 *)(puVar2->super_base_blob<256U>).m_data._M_elems;
    uVar4 = *(undefined4 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 4);
    uVar5 = *(undefined4 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 8);
    uVar6 = *(undefined4 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0xc);
    uVar7 = *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x18);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x10) =
         *(undefined8 *)((puVar2->super_base_blob<256U>).m_data._M_elems + 0x10);
    *(undefined8 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0x18) = uVar7;
    *(undefined4 *)(__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems = uVar3;
    *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 4) = uVar4;
    *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 8) = uVar5;
    *(undefined4 *)((__return_storage_ptr__->super_base_blob<256U>).m_data._M_elems + 0xc) = uVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

uint256 getBestBlockHash() override
    {
        const CBlockIndex* tip = WITH_LOCK(::cs_main, return chainman().ActiveChain().Tip());
        return tip ? tip->GetBlockHash() : chainman().GetParams().GenesisBlock().GetHash();
    }